

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O0

void update_key(SDL_Keycode sdlk,_Bool state)

{
  _Bool _Var1;
  KEYINPUT_t *pKVar2;
  byte in_SIL;
  int in_EDI;
  KEYINPUT_t *KEYINPUT;
  
  _Var1 = (_Bool)(in_SIL & 1);
  pKVar2 = get_keyinput();
  if (in_EDI == 0xd) {
    pKVar2->raw = pKVar2->raw & 0xfff7 | (ushort)((_Var1 ^ 0xffU) & 1) << 3;
    return;
  }
  if (in_EDI == 0x1b) {
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  User pressed escape\n\x1b[0;m");
    }
    if ((ctrl_state & 1U) == 0) {
      return;
    }
    should_quit = true;
    return;
  }
  if (in_EDI == 0x30) {
    save_load(false,0x15e983);
    return;
  }
  if (in_EDI == 0x31) {
    save_load(false,0x15e8ba);
    return;
  }
  if (in_EDI == 0x32) {
    save_load(false,0x15e8d2);
    return;
  }
  if (in_EDI == 0x33) {
    save_load(false,0x15e8ea);
    return;
  }
  if (in_EDI == 0x34) {
    save_load(false,0x15e902);
    return;
  }
  if (in_EDI == 0x35) {
    save_load(false,0x15e91a);
    return;
  }
  if (in_EDI == 0x36) {
    save_load(false,0x15e92f);
    return;
  }
  if (in_EDI == 0x37) {
    save_load(false,0x15e944);
    return;
  }
  if (in_EDI == 0x38) {
    save_load(false,0x15e959);
    return;
  }
  if (in_EDI == 0x39) {
    save_load(false,0x15e96e);
    return;
  }
  if (in_EDI == 0x61) {
LAB_0015e755:
    pKVar2->raw = pKVar2->raw & 0xffdf | (ushort)((_Var1 ^ 0xffU) & 1) << 5;
    return;
  }
  if (in_EDI == 100) {
LAB_0015e780:
    pKVar2->raw = pKVar2->raw & 0xffef | (ushort)((_Var1 ^ 0xffU) & 1) << 4;
    return;
  }
  if (in_EDI == 0x65) {
    pKVar2->raw = pKVar2->raw & 0xfeff | (ushort)((_Var1 ^ 0xffU) & 1) << 8;
    return;
  }
  if (in_EDI == 0x6a) {
    pKVar2->raw = pKVar2->raw & 0xfffe | (ushort)((_Var1 ^ 0xffU) & 1);
    return;
  }
  if (in_EDI == 0x6b) {
    pKVar2->raw = pKVar2->raw & 0xfffd | (ushort)((_Var1 ^ 0xffU) & 1) << 1;
    return;
  }
  if (in_EDI == 0x71) {
    pKVar2->raw = pKVar2->raw & 0xfdff | (ushort)((_Var1 ^ 0xffU) & 1) << 9;
    return;
  }
  if (in_EDI == 0x73) {
LAB_0015e729:
    pKVar2->raw = pKVar2->raw & 0xff7f | (ushort)((_Var1 ^ 0xffU) & 1) << 7;
  }
  else {
    if (in_EDI != 0x77) {
      if (in_EDI == 0x4000004f) goto LAB_0015e780;
      if (in_EDI == 0x40000050) goto LAB_0015e755;
      if (in_EDI == 0x40000051) goto LAB_0015e729;
      if (in_EDI != 0x40000052) {
        if (in_EDI == 0x400000e0) {
          ctrl_state = _Var1;
          return;
        }
        if (in_EDI == 0x400000e4) {
          ctrl_state = _Var1;
          return;
        }
        if (in_EDI != 0x400000e5) {
          return;
        }
        pKVar2->raw = pKVar2->raw & 0xfffb | (ushort)((_Var1 ^ 0xffU) & 1) << 2;
        return;
      }
    }
    pKVar2->raw = pKVar2->raw & 0xffbf | (ushort)((_Var1 ^ 0xffU) & 1) << 6;
  }
  return;
}

Assistant:

void update_key(SDL_Keycode sdlk, bool state) {
    KEYINPUT_t* KEYINPUT = get_keyinput();
    switch (sdlk) {
        case SDLK_LCTRL:
        case SDLK_RCTRL:
            ctrl_state = state;
            break;
        case SDLK_ESCAPE:
            logwarn("User pressed escape")
            if (ctrl_state) {
                should_quit = true;
            }
            break;
        case SDLK_UP:
        case SDLK_w:
            KEYINPUT->up = !state;
            break;
        case SDLK_DOWN:
        case SDLK_s:
            KEYINPUT->down = !state;
            break;
        case SDLK_LEFT:
        case SDLK_a:
            KEYINPUT->left = !state;
            break;
        case SDLK_RIGHT:
        case SDLK_d:
            KEYINPUT->right = !state;
            break;
        case SDLK_j:
            KEYINPUT->a = !state;
            break;
        case SDLK_k:
            KEYINPUT->b = !state;
            break;
        case SDLK_RETURN:
            KEYINPUT->start = !state;
            break;
        case SDLK_RSHIFT:
            KEYINPUT->select = !state;
            break;
        case SDLK_q:
            KEYINPUT->l = !state;
            break;
        case SDLK_e:
            KEYINPUT->r = !state;
            break;
        case SDLK_1:
            save_load(state, 0);
            break;
        case SDLK_2:
            save_load(state, 1);
            break;
        case SDLK_3:
            save_load(state, 2);
            break;
        case SDLK_4:
            save_load(state, 3);
            break;
        case SDLK_5:
            save_load(state, 4);
            break;
        case SDLK_6:
            save_load(state, 5);
            break;
        case SDLK_7:
            save_load(state, 6);
            break;
        case SDLK_8:
            save_load(state, 7);
            break;
        case SDLK_9:
            save_load(state, 8);
            break;
        case SDLK_0:
            save_load(state, 9);
            break;
        default:
            break;
    }
}